

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyn_tbl.cpp
# Opt level: O1

void dyn_tbl_get_heavy_key(dyn_tbl_t *dyn_tbl,longlong thresh,uchar *keys,int *num_key)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  int iVar4;
  _Hash_node_base *p_Var5;
  
  p_Var5 = (dyn_tbl->array)._M_h._M_before_begin._M_nxt;
  if (p_Var5 == (_Hash_node_base *)0x0) {
    iVar4 = 0;
  }
  else {
    uVar1 = dyn_tbl->decrement;
    iVar4 = 0;
    do {
      p_Var2 = p_Var5[3]._M_nxt;
      p_Var3 = (_Hash_node_base *)-(long)p_Var2;
      if (0 < (long)p_Var2) {
        p_Var3 = p_Var2;
      }
      if ((long)(thresh - (ulong)uVar1) <= (long)p_Var3) {
        memcpy(keys + (dyn_tbl->lgn * iVar4 >> 3),p_Var5 + 1,(ulong)(dyn_tbl->lgn >> 3));
        iVar4 = iVar4 + 1;
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  *num_key = iVar4;
  return;
}

Assistant:

void dyn_tbl_get_heavy_key(dyn_tbl_t* dyn_tbl, long long thresh, unsigned char* keys, int* num_key) {
	long long bias = dyn_tbl->decrement;
	thresh = thresh - bias;
	//for(std::unordered_map<dyn_tbl_key_t, long long>::iterator it = dyn_tbl->array.begin(); it != dyn_tbl->array.end(); ++it) {
	int n = 0;
	for (auto it = dyn_tbl->array.begin(); it != dyn_tbl->array.end(); ++it) {
		if (abs(it->second) >= thresh) {
			memcpy(keys + n * dyn_tbl->lgn / 8, it->first.key, dyn_tbl->lgn / 8);
			n++;
			// dyn_tbl_key_t key = it->first;
			// ret.insert(key);
		}
	}

	*num_key = n;
}